

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

FindInfo __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
::find_first_non_full
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
           *this,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [12];
  undefined1 auVar13 [13];
  undefined1 auVar14 [14];
  ulong uVar15;
  ulong in_RDX;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  FindInfo FVar19;
  
  uVar2 = this->capacity_;
  uVar15 = uVar2 + 1;
  if ((uVar15 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar16 = hashval >> 7 & uVar2;
  uVar18 = 0;
  do {
    pcVar1 = this->ctrl_ + uVar16;
    iVar7 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                   CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                   CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                   CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar1 < (char)iVar7);
    in_XMM1_Bb = -(pcVar1[1] < (char)((uint)iVar7 >> 8));
    in_XMM1_Bc = -(pcVar1[2] < (char)((uint)iVar7 >> 0x10));
    in_XMM1_Bd = -(pcVar1[3] < (char)((uint)iVar7 >> 0x18));
    in_XMM1_Be = -(pcVar1[4] < (char)iVar8);
    in_XMM1_Bf = -(pcVar1[5] < (char)((uint)iVar8 >> 8));
    in_XMM1_Bg = -(pcVar1[6] < (char)((uint)iVar8 >> 0x10));
    in_XMM1_Bh = -(pcVar1[7] < (char)((uint)iVar8 >> 0x18));
    in_XMM1_Bi = -(pcVar1[8] < (char)iVar9);
    in_XMM1_Bj = -(pcVar1[9] < (char)((uint)iVar9 >> 8));
    in_XMM1_Bk = -(pcVar1[10] < (char)((uint)iVar9 >> 0x10));
    in_XMM1_Bl = -(pcVar1[0xb] < (char)((uint)iVar9 >> 0x18));
    in_XMM1_Bm = -(pcVar1[0xc] < (char)iVar10);
    in_XMM1_Bn = -(pcVar1[0xd] < (char)((uint)iVar10 >> 8));
    in_XMM1_Bo = -(pcVar1[0xe] < (char)((uint)iVar10 >> 0x10));
    in_XMM1_Bp = -(pcVar1[0xf] < (char)((uint)iVar10 >> 0x18));
    auVar5[1] = in_XMM1_Bb;
    auVar5[0] = in_XMM1_Ba;
    auVar5[2] = in_XMM1_Bc;
    auVar5[3] = in_XMM1_Bd;
    auVar5[4] = in_XMM1_Be;
    auVar5[5] = in_XMM1_Bf;
    auVar5[6] = in_XMM1_Bg;
    auVar5[7] = in_XMM1_Bh;
    auVar5[8] = in_XMM1_Bi;
    auVar5[9] = in_XMM1_Bj;
    auVar5[10] = in_XMM1_Bk;
    auVar5[0xb] = in_XMM1_Bl;
    auVar5[0xc] = in_XMM1_Bm;
    auVar5[0xd] = in_XMM1_Bn;
    auVar5[0xe] = in_XMM1_Bo;
    auVar5[0xf] = in_XMM1_Bp;
    auVar6[1] = in_XMM1_Bb;
    auVar6[0] = in_XMM1_Ba;
    auVar6[2] = in_XMM1_Bc;
    auVar6[3] = in_XMM1_Bd;
    auVar6[4] = in_XMM1_Be;
    auVar6[5] = in_XMM1_Bf;
    auVar6[6] = in_XMM1_Bg;
    auVar6[7] = in_XMM1_Bh;
    auVar6[8] = in_XMM1_Bi;
    auVar6[9] = in_XMM1_Bj;
    auVar6[10] = in_XMM1_Bk;
    auVar6[0xb] = in_XMM1_Bl;
    auVar6[0xc] = in_XMM1_Bm;
    auVar6[0xd] = in_XMM1_Bn;
    auVar6[0xe] = in_XMM1_Bo;
    auVar6[0xf] = in_XMM1_Bp;
    auVar14[1] = in_XMM1_Bd;
    auVar14[0] = in_XMM1_Bc;
    auVar14[2] = in_XMM1_Be;
    auVar14[3] = in_XMM1_Bf;
    auVar14[4] = in_XMM1_Bg;
    auVar14[5] = in_XMM1_Bh;
    auVar14[6] = in_XMM1_Bi;
    auVar14[7] = in_XMM1_Bj;
    auVar14[8] = in_XMM1_Bk;
    auVar14[9] = in_XMM1_Bl;
    auVar14[10] = in_XMM1_Bm;
    auVar14[0xb] = in_XMM1_Bn;
    auVar14[0xc] = in_XMM1_Bo;
    auVar14[0xd] = in_XMM1_Bp;
    auVar13[1] = in_XMM1_Be;
    auVar13[0] = in_XMM1_Bd;
    auVar13[2] = in_XMM1_Bf;
    auVar13[3] = in_XMM1_Bg;
    auVar13[4] = in_XMM1_Bh;
    auVar13[5] = in_XMM1_Bi;
    auVar13[6] = in_XMM1_Bj;
    auVar13[7] = in_XMM1_Bk;
    auVar13[8] = in_XMM1_Bl;
    auVar13[9] = in_XMM1_Bm;
    auVar13[10] = in_XMM1_Bn;
    auVar13[0xb] = in_XMM1_Bo;
    auVar13[0xc] = in_XMM1_Bp;
    auVar12[1] = in_XMM1_Bf;
    auVar12[0] = in_XMM1_Be;
    auVar12[2] = in_XMM1_Bg;
    auVar12[3] = in_XMM1_Bh;
    auVar12[4] = in_XMM1_Bi;
    auVar12[5] = in_XMM1_Bj;
    auVar12[6] = in_XMM1_Bk;
    auVar12[7] = in_XMM1_Bl;
    auVar12[8] = in_XMM1_Bm;
    auVar12[9] = in_XMM1_Bn;
    auVar12[10] = in_XMM1_Bo;
    auVar12[0xb] = in_XMM1_Bp;
    auVar11[1] = in_XMM1_Bg;
    auVar11[0] = in_XMM1_Bf;
    auVar11[2] = in_XMM1_Bh;
    auVar11[3] = in_XMM1_Bi;
    auVar11[4] = in_XMM1_Bj;
    auVar11[5] = in_XMM1_Bk;
    auVar11[6] = in_XMM1_Bl;
    auVar11[7] = in_XMM1_Bm;
    auVar11[8] = in_XMM1_Bn;
    auVar11[9] = in_XMM1_Bo;
    auVar11[10] = in_XMM1_Bp;
    uVar4 = (ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
            (ushort)(SUB121(auVar12 >> 7,0) & 1) << 4 | (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
            (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                     CONCAT18(in_XMM1_Bo,
                                              CONCAT17(in_XMM1_Bn,
                                                       CONCAT16(in_XMM1_Bm,
                                                                CONCAT15(in_XMM1_Bl,
                                                                         CONCAT14(in_XMM1_Bk,
                                                                                  CONCAT13(
                                                  in_XMM1_Bj,
                                                  CONCAT12(in_XMM1_Bi,
                                                           CONCAT11(in_XMM1_Bh,in_XMM1_Bg)))))))))
                           >> 7) & 1) << 6 |
            (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                     CONCAT17(in_XMM1_Bo,
                                              CONCAT16(in_XMM1_Bn,
                                                       CONCAT15(in_XMM1_Bm,
                                                                CONCAT14(in_XMM1_Bl,
                                                                         CONCAT13(in_XMM1_Bk,
                                                                                  CONCAT12(
                                                  in_XMM1_Bj,CONCAT11(in_XMM1_Bi,in_XMM1_Bh))))))))
                           >> 7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf;
    if (uVar4 == 0) {
      if (uVar2 <= uVar18) {
        __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                      ,0x974,
                      "FindInfo phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs_impl::any>>>::find_first_non_full(size_t) [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs_impl::any>>]"
                     );
      }
      lVar17 = uVar16 + uVar18;
      uVar18 = uVar18 + 0x10;
      uVar16 = lVar17 + 0x10U & uVar2;
    }
    else {
      uVar3 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar15 = uVar3 + uVar16 & uVar2;
      in_RDX = uVar18;
    }
  } while (uVar4 == 0);
  FVar19.probe_length = in_RDX;
  FVar19.offset = uVar15;
  return FVar19;
}

Assistant:

FindInfo find_first_non_full(size_t hashval)
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ctrl_ + seq.offset()};
					auto mask = g.MatchEmptyOrDeleted();
					if (mask) {
						return {seq.offset((size_t)mask.LowestBitSet()), seq.getindex()};
					}
					assert(seq.getindex() < capacity_ && "full table!");
					seq.next();
				}
			}